

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# kws_search.c
# Opt level: O0

char * kws_search_get_keyphrases(ps_search_t *search)

{
  char *__s;
  int iVar1;
  size_t sVar2;
  char *pcVar3;
  char *str;
  gnode_t *gn;
  char *line;
  kws_search_t *kwss;
  int len;
  int c;
  ps_search_t *search_local;
  
  kwss._0_4_ = 0;
  for (str = search[1].type; str != (char *)0x0; str = *(char **)(str + 8)) {
    sVar2 = strlen((char *)**(undefined8 **)str);
    kwss._0_4_ = (int)kwss + (int)sVar2 + 1;
  }
  kwss._4_4_ = 0;
  pcVar3 = (char *)__ckd_calloc__((long)(int)kwss,1,
                                  "/workspace/llm4binary/github/license_c_cmakelists/cmusphinx[P]pocketsphinx/src/kws_search.c"
                                  ,0x2bd);
  for (str = search[1].type; str != (char *)0x0; str = *(char **)(str + 8)) {
    __s = (char *)**(undefined8 **)str;
    sVar2 = strlen(__s);
    memcpy(pcVar3 + kwss._4_4_,__s,sVar2);
    sVar2 = strlen(__s);
    iVar1 = kwss._4_4_ + (int)sVar2;
    kwss._4_4_ = iVar1 + 1;
    pcVar3[iVar1] = '\n';
  }
  pcVar3[kwss._4_4_ + -1] = '\0';
  return pcVar3;
}

Assistant:

char * 
kws_search_get_keyphrases(ps_search_t * search)
{
    int c, len;
    kws_search_t *kwss;
    char* line;
    gnode_t *gn;

    kwss = (kws_search_t *) search;

    len = 0;
    for (gn = kwss->keyphrases; gn; gn = gnode_next(gn))
        len += strlen(((kws_keyphrase_t *)gnode_ptr(gn))->word) + 1;

    c = 0;
    line = (char *)ckd_calloc(len, sizeof(*line));
    for (gn = kwss->keyphrases; gn; gn = gnode_next(gn)) {
        const char *str = ((kws_keyphrase_t *)gnode_ptr(gn))->word;
        memcpy(&line[c], str, strlen(str));
        c += strlen(str);
        line[c++] = '\n';
    }
    line[--c] = '\0';

    return line;
}